

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  int iVar3;
  Mem *pMVar4;
  i64 iVar5;
  uchar *zText;
  int iCol;
  long lVar6;
  u32 *pnWord;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  int rc;
  int local_54;
  sqlite3_value *local_50;
  sqlite3_stmt *local_48;
  sqlite3_value *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = 0;
  local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = pRowid;
  local_40 = pRowid;
  iVar2 = fts3SqlStmt(p,7,&local_48,&local_40);
  psVar1 = local_48;
  if (iVar2 != 0) {
    sqlite3_reset(local_48);
    bVar9 = false;
    local_54 = iVar2;
    goto LAB_001cff55;
  }
  iVar2 = sqlite3_step(local_48);
  bVar9 = false;
  if (iVar2 == 100) {
    iVar2 = langidFromSelect(p,psVar1);
    pMVar4 = columnMem(psVar1,0);
    iVar5 = sqlite3VdbeIntValue(pMVar4);
    columnMallocFailure(psVar1);
    iVar3 = fts3PendingTermsDocid(p,1,iVar2,iVar5);
    bVar8 = iVar3 == 0;
    if (bVar8) {
      if (p->nColumn < 1) {
        bVar8 = true;
      }
      else {
        lVar6 = 0;
        pnWord = aSzDel;
        do {
          iVar3 = 0;
          if (p->abNotindexed[lVar6] == '\0') {
            iVar7 = (int)lVar6 + 1;
            zText = sqlite3_column_text(psVar1,iVar7);
            iVar3 = fts3PendingTermsAdd(p,iVar2,(char *)zText,-1,pnWord);
            iVar7 = sqlite3_column_bytes(psVar1,iVar7);
            aSzDel[p->nColumn] = aSzDel[p->nColumn] + iVar7;
          }
          bVar8 = iVar3 == 0;
          if (!bVar8) goto LAB_001cff28;
          lVar6 = lVar6 + 1;
          pnWord = pnWord + 1;
        } while (lVar6 < p->nColumn);
      }
      bVar9 = true;
      if (!bVar8) goto LAB_001cff28;
    }
    else {
LAB_001cff28:
      sqlite3_reset(psVar1);
      bVar9 = false;
      local_54 = iVar3;
    }
    if (!bVar8) goto LAB_001cff55;
  }
  local_54 = sqlite3_reset(psVar1);
LAB_001cff55:
  if ((bVar9) && (local_54 == 0)) {
    local_40 = local_50;
    local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
    iVar2 = 0;
    bVar9 = true;
    if ((p->zContentTbl == (char *)0x0) &&
       (iVar2 = fts3SqlStmt(p,1,&local_48,&local_40), psVar1 = local_48, iVar2 == 0)) {
      iVar2 = sqlite3_step(local_48);
      bVar9 = true;
      if (iVar2 == 100) {
        pMVar4 = columnMem(psVar1,0);
        iVar5 = sqlite3VdbeIntValue(pMVar4);
        columnMallocFailure(psVar1);
        bVar9 = (int)iVar5 == 0;
      }
      iVar2 = sqlite3_reset(psVar1);
    }
    local_54 = iVar2;
    if (iVar2 == 0) {
      if (bVar9) {
        *pnChng = *pnChng + -1;
        if (p->zContentTbl == (char *)0x0) {
          fts3SqlExec(&local_54,p,0,&local_50);
        }
        if (p->bHasDocsize != '\0') {
          fts3SqlExec(&local_54,p,0x13,&local_50);
        }
      }
      else {
        local_54 = fts3DeleteAll(p,1);
        *pnChng = 0;
        memset(aSzDel,0,(long)p->nColumn * 8 + 8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p,
  sqlite3_value *pRowid,
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}